

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.c
# Opt level: O1

LY_STMT lys_snode2stmt(LYS_NODE nodetype)

{
  if ((int)nodetype < 0x100) {
    if ((int)nodetype < 0x10) {
      switch(nodetype) {
      case LYS_CONTAINER:
        return LY_STMT_CONTAINER;
      case LYS_CHOICE:
        return LY_STMT_CHOICE;
      case LYS_LEAF:
        return LY_STMT_LEAF;
      case LYS_LEAFLIST:
        return LY_STMT_LEAFLIST;
      }
    }
    else if ((int)nodetype < 0x40) {
      if (nodetype == LYS_LIST) {
        return LY_STMT_LIST;
      }
      if (nodetype == LYS_ANYXML) {
        return LY_STMT_ANYDATA;
      }
    }
    else {
      if (nodetype == LYS_CASE) {
        return LY_STMT_CASE;
      }
      if (nodetype == LYS_NOTIF) {
        return LY_STMT_NOTIFICATION;
      }
    }
  }
  else if ((int)nodetype < 0x1000) {
    if ((int)nodetype < 0x400) {
      if (nodetype == LYS_RPC) {
        return LY_STMT_RPC;
      }
      if (nodetype == LYS_INPUT) {
        return LY_STMT_INPUT;
      }
    }
    else {
      if (nodetype == LYS_OUTPUT) {
        return LY_STMT_OUTPUT;
      }
      if (nodetype == LYS_GROUPING) {
        return LY_STMT_GROUPING;
      }
    }
  }
  else if ((int)nodetype < 0x4000) {
    if (nodetype == LYS_USES) {
      return LY_STMT_USES;
    }
    if (nodetype == LYS_AUGMENT) {
      return LY_STMT_AUGMENT;
    }
  }
  else {
    if (nodetype == LYS_ACTION) {
      return LY_STMT_ACTION;
    }
    if (nodetype == LYS_ANYDATA) {
      return LY_STMT_ANYDATA;
    }
  }
  return LY_STMT_NODE;
}

Assistant:

LY_STMT
lys_snode2stmt(LYS_NODE nodetype)
{
    switch(nodetype) {
    case LYS_CONTAINER:
        return LY_STMT_CONTAINER;
    case LYS_CHOICE:
        return LY_STMT_CHOICE;
    case LYS_LEAF:
        return LY_STMT_LEAF;
    case LYS_LEAFLIST:
        return LY_STMT_LEAFLIST;
    case LYS_LIST:
        return LY_STMT_LIST;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return LY_STMT_ANYDATA;
    case LYS_CASE:
        return LY_STMT_CASE;
    case LYS_NOTIF:
        return LY_STMT_NOTIFICATION;
    case LYS_RPC:
        return LY_STMT_RPC;
    case LYS_INPUT:
        return LY_STMT_INPUT;
    case LYS_OUTPUT:
        return LY_STMT_OUTPUT;
    case LYS_GROUPING:
        return LY_STMT_GROUPING;
    case LYS_USES:
        return LY_STMT_USES;
    case LYS_AUGMENT:
        return LY_STMT_AUGMENT;
    case LYS_ACTION:
        return LY_STMT_ACTION;
    default:
        return LY_STMT_NODE;
    }
}